

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::IsPopupOpen(char *str_id,ImGuiPopupFlags popup_flags)

{
  bool bVar1;
  ImGuiID local_28;
  ImGuiID id;
  ImGuiContext *g;
  ImGuiPopupFlags popup_flags_local;
  char *str_id_local;
  
  if ((popup_flags & 0x80U) == 0) {
    local_28 = ImGuiWindow::GetID(GImGui->CurrentWindow,str_id,(char *)0x0);
  }
  else {
    local_28 = 0;
  }
  if (((popup_flags & 0x100U) != 0) && (local_28 != 0)) {
    __assert_fail("0 && \"Cannot use IsPopupOpen() with a string id and ImGuiPopupFlags_AnyPopupLevel.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui.cpp"
                  ,0x25c6,"bool ImGui::IsPopupOpen(const char *, ImGuiPopupFlags)");
  }
  bVar1 = IsPopupOpen(local_28,popup_flags);
  return bVar1;
}

Assistant:

bool ImGui::IsPopupOpen(const char* str_id, ImGuiPopupFlags popup_flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiID id = (popup_flags & ImGuiPopupFlags_AnyPopupId) ? 0 : g.CurrentWindow->GetID(str_id);
    if ((popup_flags & ImGuiPopupFlags_AnyPopupLevel) && id != 0)
        IM_ASSERT(0 && "Cannot use IsPopupOpen() with a string id and ImGuiPopupFlags_AnyPopupLevel."); // But non-string version is legal and used internally
    return IsPopupOpen(id, popup_flags);
}